

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

SeatPromptResult *
verify_ssh_host_key(SeatPromptResult *__return_storage_ptr__,InteractionReadySeat iseat,Conf *conf,
                   char *host,int port,ssh_key *key,char *keytype,char *keystr,char *keydisp,
                   char **fingerprints,int ca_count,_func_void_void_ptr_SeatPromptResult *callback,
                   void *ctx)

{
  int iVar1;
  FingerprintType FVar2;
  char *pcVar3;
  char *pcVar4;
  strbuf *buf_o;
  SeatDialogText *sdt;
  SeatDialogPromptDescriptions *pSVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  
  pcVar3 = conf_get_str_nthstrkey(conf,0xc3,0);
  if (pcVar3 != (char *)0x0) {
    if (fingerprints != (char **)0x0) {
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        pcVar3 = fingerprints[lVar6];
        if (pcVar3 != (char *)0x0) {
          pcVar4 = strrchr(pcVar3,0x20);
          pcVar9 = pcVar4 + 1;
          if (pcVar4 == (char *)0x0) {
            pcVar9 = pcVar3;
          }
          pcVar3 = conf_get_str_str_opt(conf,0xc3,pcVar9);
          if (pcVar3 != (char *)0x0) goto LAB_0011e7b2;
        }
      }
    }
    if (key != (ssh_key *)0x0) {
      buf_o = strbuf_new();
      (*key->vt->public_blob)(key,buf_o->binarysink_);
      uVar8 = 0;
      uVar7 = (buf_o->len + 2) / 3;
      iVar1 = (int)uVar7;
      lVar6 = (long)iVar1 * 4;
      pcVar3 = (char *)safemalloc((long)((int)lVar6 + 1),1,0);
      uVar7 = uVar7 & 0xffffffff;
      if (iVar1 < 1) {
        uVar7 = uVar8;
      }
      pcVar9 = pcVar3;
      for (lVar10 = 0; uVar7 * 3 != lVar10; lVar10 = lVar10 + 3) {
        base64_encode_atom(buf_o->u + lVar10,(int)buf_o->len + (int)uVar8,pcVar9);
        pcVar9 = pcVar9 + 4;
        uVar8 = (ulong)((int)uVar8 - 3);
      }
      pcVar3[lVar6] = '\0';
      strbuf_free(buf_o);
      pcVar9 = conf_get_str_str_opt(conf,0xc3,pcVar3);
      safefree(pcVar3);
      if (pcVar9 != (char *)0x0) goto LAB_0011e7b2;
    }
    make_spr_sw_abort_static(__return_storage_ptr__,"Host key not in manually configured list");
    return __return_storage_ptr__;
  }
  iVar1 = check_stored_host_key(host,port,keytype,keystr);
  if (iVar1 == 0) {
LAB_0011e7b2:
    __return_storage_ptr__->kind = SPRK_OK;
    __return_storage_ptr__->errdata_lit = (char *)0x0;
    return __return_storage_ptr__;
  }
  sdt = seat_dialog_text_new();
  pSVar5 = (*(iseat.seat)->vt->prompt_descriptions)(iseat.seat);
  FVar2 = ssh2_pick_default_fingerprint(fingerprints);
  seat_dialog_text_append(sdt,SDT_TITLE,"%s Security Alert","PSCP");
  if ((key == (ssh_key *)0x0) || (key->vt->is_certificate != true)) {
    if (iVar1 == 1) {
      seat_dialog_text_append(sdt,SDT_PARA,"The host key is not cached for this server:");
      seat_dialog_text_append(sdt,SDT_DISPLAY,"%s (port %d)",host,(ulong)(uint)port);
      pcVar3 = "The server\'s %s key fingerprint is:";
      pcVar9 = "You have no guarantee that the server is the computer you think it is.";
    }
    else {
      seat_dialog_text_append(sdt,SDT_SCARY_HEADING,"WARNING - POTENTIAL SECURITY BREACH!");
      seat_dialog_text_append
                (sdt,SDT_PARA,"The host key does not match the one %s has cached for this server:",
                 "PSCP");
      seat_dialog_text_append(sdt,SDT_DISPLAY,"%s (port %d)",host,(ulong)(uint)port);
      pcVar3 = "The new %s key fingerprint is:";
      pcVar9 = 
      "This means that either the server administrator has changed the host key, or you have actually connected to another computer pretending to be the server."
      ;
    }
  }
  else {
    seat_dialog_text_append(sdt,SDT_SCARY_HEADING,"WARNING - POTENTIAL SECURITY BREACH!");
    seat_dialog_text_append(sdt,SDT_PARA,"This server presented a certified host key:");
    seat_dialog_text_append(sdt,SDT_DISPLAY,"%s (port %d)",host,(ulong)(uint)port);
    if (ca_count == 0) {
      if (iVar1 != 2) {
        __assert_fail("storage_status == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                      ,0x3c8,
                      "SeatPromptResult verify_ssh_host_key(InteractionReadySeat, Conf *, const char *, int, ssh_key *, const char *, char *, const char *, char **, int, void (*)(void *, SeatPromptResult), void *)"
                     );
      }
      pcVar9 = 
      "This means that either the server administrator has changed the host key, or you have actually connected to another computer pretending to be the server."
      ;
      pcVar3 = "which does not match the certified key %s had previously cached for this server.";
    }
    else {
      pcVar3 = "one";
      if (1 < ca_count) {
        pcVar3 = "ones";
      }
      seat_dialog_text_append
                (sdt,SDT_PARA,
                 "which was signed by a different certification authority from the %s %s is configured to trust for this server."
                 ,pcVar3,"PSCP");
      if (iVar1 != 2) {
        pcVar3 = "The new %s key fingerprint is:";
        pcVar9 = 
        "This means that either another certification authority is operating in this realm, or you have actually connected to another computer pretending to be the server."
        ;
        goto LAB_0011e8c8;
      }
      pcVar9 = 
      "This means that either another certification authority is operating in this realm AND the server administrator has changed the host key, or you have actually connected to another computer pretending to be the server."
      ;
      pcVar3 = "ALSO, that key does not match the key %s had previously cached for this server.";
    }
    seat_dialog_text_append(sdt,SDT_PARA,pcVar3,"PSCP");
    pcVar3 = "The new %s key fingerprint is:";
  }
LAB_0011e8c8:
  seat_dialog_text_append(sdt,SDT_PARA,pcVar9);
  seat_dialog_text_append(sdt,SDT_PARA,pcVar3,keytype);
  seat_dialog_text_append(sdt,SDT_DISPLAY,"%s",fingerprints[FVar2]);
  seat_dialog_text_append(sdt,SDT_BATCH_ABORT,"Connection abandoned.");
  if (iVar1 == 1) {
    seat_dialog_text_append
              (sdt,SDT_PARA,
               "If you trust this host, %s to add the key to %s\'s cache and carry on connecting.",
               pSVar5->hk_accept_action,"PSCP");
    seat_dialog_text_append
              (sdt,SDT_PARA,
               "If you want to carry on connecting just once, without adding the key to the cache, %s."
               ,pSVar5->hk_connect_once_action);
    seat_dialog_text_append
              (sdt,SDT_PARA,"If you do not trust this host, %s to abandon the connection.",
               pSVar5->hk_cancel_action);
    pcVar3 = "Store key in cache?";
  }
  else {
    seat_dialog_text_append
              (sdt,SDT_PARA,
               "If you were expecting this change and trust the new key, %s to update %s\'s cache and carry on connecting."
               ,pSVar5->hk_accept_action,"PSCP");
    seat_dialog_text_append
              (sdt,SDT_PARA,"If you want to carry on connecting but without updating the cache, %s."
               ,pSVar5->hk_connect_once_action);
    seat_dialog_text_append
              (sdt,SDT_PARA,
               "If you want to abandon the connection completely, %s to cancel. %s is the ONLY guaranteed safe choice."
               ,pSVar5->hk_cancel_action,pSVar5->hk_cancel_action_Participle);
    pcVar3 = "Update cached key?";
  }
  seat_dialog_text_append(sdt,SDT_PROMPT,pcVar3);
  seat_dialog_text_append(sdt,SDT_MORE_INFO_KEY,"Full text of host\'s public key");
  seat_dialog_text_append(sdt,SDT_MORE_INFO_VALUE_BLOB,"%s",keydisp);
  if (fingerprints[1] != (char *)0x0) {
    seat_dialog_text_append(sdt,SDT_MORE_INFO_KEY,"SHA256 fingerprint");
    seat_dialog_text_append(sdt,SDT_MORE_INFO_VALUE_SHORT,"%s",fingerprints[1]);
  }
  if (*fingerprints != (char *)0x0) {
    seat_dialog_text_append(sdt,SDT_MORE_INFO_KEY,"MD5 fingerprint");
    seat_dialog_text_append(sdt,SDT_MORE_INFO_VALUE_SHORT,"%s",*fingerprints);
  }
  (*(iseat.seat)->vt->confirm_ssh_host_key)
            (__return_storage_ptr__,iseat.seat,host,port,keytype,keystr,sdt,(HelpCtx)0x0,callback,
             ctx);
  seat_dialog_text_free(sdt);
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult verify_ssh_host_key(
    InteractionReadySeat iseat, Conf *conf, const char *host, int port,
    ssh_key *key, const char *keytype, char *keystr, const char *keydisp,
    char **fingerprints, int ca_count,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    /*
     * First, check if the Conf includes a manual specification of the
     * expected host key. If so, that completely supersedes everything
     * else, including the normal host key cache _and_ including
     * manual overrides: we return success or failure immediately,
     * entirely based on whether the key matches the Conf.
     */
    if (conf_get_str_nthstrkey(conf, CONF_ssh_manual_hostkeys, 0)) {
        if (fingerprints) {
            for (size_t i = 0; i < SSH_N_FPTYPES; i++) {
                /*
                 * Each fingerprint string we've been given will have
                 * things like 'ssh-rsa 2048' at the front of it. Strip
                 * those off and narrow down to just the hash at the end
                 * of the string.
                 */
                const char *fingerprint = fingerprints[i];
                if (!fingerprint)
                    continue;
                const char *p = strrchr(fingerprint, ' ');
                fingerprint = p ? p+1 : fingerprint;
                if (conf_get_str_str_opt(conf, CONF_ssh_manual_hostkeys,
                                         fingerprint))
                    return SPR_OK;
            }
        }

        if (key) {
            /*
             * Construct the base64-encoded public key blob and see if
             * that's listed.
             */
            strbuf *binblob;
            char *base64blob;
            int atoms, i;
            binblob = strbuf_new();
            ssh_key_public_blob(key, BinarySink_UPCAST(binblob));
            atoms = (binblob->len + 2) / 3;
            base64blob = snewn(atoms * 4 + 1, char);
            for (i = 0; i < atoms; i++)
                base64_encode_atom(binblob->u + 3*i,
                                   binblob->len - 3*i, base64blob + 4*i);
            base64blob[atoms * 4] = '\0';
            strbuf_free(binblob);
            if (conf_get_str_str_opt(conf, CONF_ssh_manual_hostkeys,
                                     base64blob)) {
                sfree(base64blob);
                return SPR_OK;
            }
            sfree(base64blob);
        }

        return SPR_SW_ABORT("Host key not in manually configured list");
    }

    /*
     * Next, check the host key cache.
     */
    int storage_status = check_stored_host_key(host, port, keytype, keystr);
    if (storage_status == 0) /* matching key was found in the cache */
        return SPR_OK;

    /*
     * The key is either missing from the cache, or does not match.
     * Either way, fall back to an interactive prompt from the Seat.
     */
    SeatDialogText *text = seat_dialog_text_new();
    const SeatDialogPromptDescriptions *pds =
        seat_prompt_descriptions(iseat.seat);

    FingerprintType fptype_default =
        ssh2_pick_default_fingerprint(fingerprints);

    seat_dialog_text_append(
        text, SDT_TITLE, "%s Security Alert", appname);

    if (key && ssh_key_alg(key)->is_certificate) {
        seat_dialog_text_append(
            text, SDT_SCARY_HEADING, "WARNING - POTENTIAL SECURITY BREACH!");
        seat_dialog_text_append(
            text, SDT_PARA, "This server presented a certified host key:");
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s (port %d)", host, port);
        if (ca_count) {
            seat_dialog_text_append(
                text, SDT_PARA, "which was signed by a different "
                "certification authority from the %s %s is configured to "
                "trust for this server.", ca_count > 1 ? "ones" : "one",
                appname);
            if (storage_status == 2) {
                seat_dialog_text_append(
                    text, SDT_PARA, "ALSO, that key does not match the key "
                    "%s had previously cached for this server.", appname);
                seat_dialog_text_append(
                    text, SDT_PARA, "This means that either another "
                    "certification authority is operating in this realm AND "
                    "the server administrator has changed the host key, or "
                    "you have actually connected to another computer "
                    "pretending to be the server.");
            } else {
                seat_dialog_text_append(
                    text, SDT_PARA, "This means that either another "
                    "certification authority is operating in this realm, or "
                    "you have actually connected to another computer "
                    "pretending to be the server.");
            }
        } else {
            assert(storage_status == 2);
            seat_dialog_text_append(
                text, SDT_PARA, "which does not match the certified key %s "
                "had previously cached for this server.", appname);
            seat_dialog_text_append(
                text, SDT_PARA, "This means that either the server "
                "administrator has changed the host key, or you have actually "
                "connected to another computer pretending to be the server.");
        }
        seat_dialog_text_append(
            text, SDT_PARA, "The new %s key fingerprint is:", keytype);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s", fingerprints[fptype_default]);
    } else if (storage_status == 1) {
        seat_dialog_text_append(
            text, SDT_PARA, "The host key is not cached for this server:");
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s (port %d)", host, port);
        seat_dialog_text_append(
            text, SDT_PARA, "You have no guarantee that the server is the "
            "computer you think it is.");
        seat_dialog_text_append(
            text, SDT_PARA, "The server's %s key fingerprint is:", keytype);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s", fingerprints[fptype_default]);
    } else {
        seat_dialog_text_append(
            text, SDT_SCARY_HEADING, "WARNING - POTENTIAL SECURITY BREACH!");
        seat_dialog_text_append(
            text, SDT_PARA, "The host key does not match the one %s has "
            "cached for this server:", appname);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s (port %d)", host, port);
        seat_dialog_text_append(
            text, SDT_PARA, "This means that either the server administrator "
            "has changed the host key, or you have actually connected to "
            "another computer pretending to be the server.");
        seat_dialog_text_append(
            text, SDT_PARA, "The new %s key fingerprint is:", keytype);
        seat_dialog_text_append(
            text, SDT_DISPLAY, "%s", fingerprints[fptype_default]);
    }

    /* The above text is printed even in batch mode. Here's where we stop if
     * we can't present interactive prompts. */
    seat_dialog_text_append(
        text, SDT_BATCH_ABORT, "Connection abandoned.");

    HelpCtx helpctx;

    if (storage_status == 1) {
        seat_dialog_text_append(
            text, SDT_PARA, "If you trust this host, %s to add the key to "
            "%s's cache and carry on connecting.",
            pds->hk_accept_action, appname);
        seat_dialog_text_append(
            text, SDT_PARA, "If you want to carry on connecting just once, "
            "without adding the key to the cache, %s.",
            pds->hk_connect_once_action);
        seat_dialog_text_append(
            text, SDT_PARA, "If you do not trust this host, %s to abandon the "
            "connection.", pds->hk_cancel_action);
        seat_dialog_text_append(
            text, SDT_PROMPT, "Store key in cache?");
        helpctx = HELPCTX(errors_hostkey_absent);
    } else {
        seat_dialog_text_append(
            text, SDT_PARA, "If you were expecting this change and trust the "
            "new key, %s to update %s's cache and carry on connecting.",
             pds->hk_accept_action, appname);
        seat_dialog_text_append(
            text, SDT_PARA, "If you want to carry on connecting but without "
            "updating the cache, %s.", pds->hk_connect_once_action);
        seat_dialog_text_append(
            text, SDT_PARA, "If you want to abandon the connection "
            "completely, %s to cancel. %s is the ONLY guaranteed safe choice.",
            pds->hk_cancel_action, pds->hk_cancel_action_Participle);
        seat_dialog_text_append(
            text, SDT_PROMPT, "Update cached key?");
        helpctx = HELPCTX(errors_hostkey_changed);
    }

    seat_dialog_text_append(text, SDT_MORE_INFO_KEY,
                            "Full text of host's public key");
    seat_dialog_text_append(text, SDT_MORE_INFO_VALUE_BLOB, "%s", keydisp);

    if (fingerprints[SSH_FPTYPE_SHA256]) {
        seat_dialog_text_append(text, SDT_MORE_INFO_KEY, "SHA256 fingerprint");
        seat_dialog_text_append(text, SDT_MORE_INFO_VALUE_SHORT, "%s",
                                fingerprints[SSH_FPTYPE_SHA256]);
    }
    if (fingerprints[SSH_FPTYPE_MD5]) {
        seat_dialog_text_append(text, SDT_MORE_INFO_KEY, "MD5 fingerprint");
        seat_dialog_text_append(text, SDT_MORE_INFO_VALUE_SHORT, "%s",
                                fingerprints[SSH_FPTYPE_MD5]);
    }

    SeatPromptResult toret = seat_confirm_ssh_host_key(
        iseat, host, port, keytype, keystr, text, helpctx, callback, ctx);
    seat_dialog_text_free(text);
    return toret;
}